

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_MappingChannel::Read(ON_MappingChannel *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  uint uVar2;
  bool local_21;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_MappingChannel *this_local;
  
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  Default(this);
  iStack_1c = 0;
  local_20 = 0;
  local_21 = ON_BinaryArchive::BeginRead3dmChunk
                       (_minor_version,0x40008000,&stack0xffffffffffffffe4,&local_20);
  if (local_21) {
    local_21 = iStack_1c == 1;
    if (local_21) {
      local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_mapping_channel_id);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_mapping_id);
    }
    if ((local_21 != false) && (0 < local_20)) {
      if (local_21 != false) {
        local_21 = ON_BinaryArchive::ReadXform(_minor_version,&this->m_object_xform);
      }
      if (((local_21 != false) &&
          (uVar2 = ON_BinaryArchive::ArchiveOpenNURBSVersion(_minor_version), uVar2 < 0xbf510ee)) &&
         (bVar1 = ON_Xform::IsZero(&this->m_object_xform), bVar1)) {
        memcpy(&this->m_object_xform,&ON_Xform::IdentityTransformation,0x80);
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      local_21 = false;
    }
  }
  return local_21;
}

Assistant:

bool ON_MappingChannel::Read( ON_BinaryArchive& archive )
{
  Default();
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (rc)
  {
    rc = (1 == major_version);
    if (rc) rc = archive.ReadInt(&m_mapping_channel_id);
    if (rc) rc = archive.ReadUuid(m_mapping_id);

    if ( rc && minor_version >= 1 )
    {
      // 1.1 field added 6 June 2006
      if (rc) rc = archive.ReadXform(m_object_xform);
      if (rc
          && archive.ArchiveOpenNURBSVersion() < 200610030
          && m_object_xform.IsZero()
          )
      {
        // Between versions 200606060 and 200610030,
        // there was a bug that created some mapping
        // channels with zero transformations.  This
        // if clause finds those and sets them to the
        // identity.
        m_object_xform = ON_Xform::IdentityTransformation;
      }
    }

    if ( !archive.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}